

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5IndexInit(sqlite3 *db)

{
  int local_14;
  int rc;
  sqlite3 *db_local;
  
  local_14 = sqlite3_create_function
                       (db,"fts5_decode",2,1,(void *)0x0,fts5DecodeFunction,
                        (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                        (_func_void_sqlite3_context_ptr *)0x0);
  if (local_14 == 0) {
    local_14 = sqlite3_create_function
                         (db,"fts5_decode_none",2,1,db,fts5DecodeFunction,
                          (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                          (_func_void_sqlite3_context_ptr *)0x0);
  }
  if (local_14 == 0) {
    local_14 = sqlite3_create_function
                         (db,"fts5_rowid",-1,1,(void *)0x0,fts5RowidFunction,
                          (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                          (_func_void_sqlite3_context_ptr *)0x0);
  }
  return local_14;
}

Assistant:

static int sqlite3Fts5IndexInit(sqlite3 *db){
  int rc = sqlite3_create_function(
      db, "fts5_decode", 2, SQLITE_UTF8, 0, fts5DecodeFunction, 0, 0
  );

  if( rc==SQLITE_OK ){
    rc = sqlite3_create_function(
        db, "fts5_decode_none", 2, 
        SQLITE_UTF8, (void*)db, fts5DecodeFunction, 0, 0
    );
  }

  if( rc==SQLITE_OK ){
    rc = sqlite3_create_function(
        db, "fts5_rowid", -1, SQLITE_UTF8, 0, fts5RowidFunction, 0, 0
    );
  }
  return rc;
}